

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep.c
# Opt level: O2

int lsrkStep_TakeStepRKL(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  long *plVar1;
  double *pdVar2;
  N_Vector *pp_Var3;
  ARKodeHAdaptMem pAVar4;
  N_Vector p_Var5;
  bool bVar6;
  double dVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  sunrealtype dsm;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined8 in_XMM3_Qb;
  double local_88;
  ARKodeLSRKStepMem step_mem;
  double local_48;
  undefined8 uStack_40;
  
  *nflagPtr = 0;
  *dsmPtr = 0.0;
  iVar8 = lsrkStep_AccessStepMem(ark_mem,"lsrkStep_TakeStepRKL",&step_mem);
  if (iVar8 == 0) {
    pdVar2 = step_mem->cvals;
    pp_Var3 = step_mem->Xvecs;
    if ((step_mem->dom_eig_update == 0) ||
       (iVar8 = lsrkStep_ComputeNewDomEig(ark_mem,step_mem), iVar8 == 0)) {
      dVar17 = ABS(ark_mem->h) * 8.0 * step_mem->spectral_radius + 9.0;
      if (dVar17 <= 0.0) {
        dVar17 = -0.5;
      }
      else {
        if (dVar17 < 0.0) {
          dVar17 = sqrt(dVar17);
        }
        else {
          dVar17 = SQRT(dVar17);
        }
        dVar17 = (dVar17 + -1.0) * 0.5;
      }
      dVar17 = ceil(dVar17);
      uVar14 = SUB84(dVar17,0);
      uVar15 = (undefined4)((ulong)dVar17 >> 0x20);
      if (dVar17 <= 2.0) {
        uVar14 = 0;
        uVar15 = 0x40000000;
      }
      iVar8 = step_mem->stage_max_limit;
      if ((double)CONCAT44(uVar15,uVar14) < (double)iVar8) {
        iVar8 = (int)(double)CONCAT44(uVar15,uVar14);
        step_mem->req_stages = iVar8;
        iVar9 = step_mem->stage_max;
        if (step_mem->stage_max <= iVar8) {
          iVar9 = iVar8;
        }
        step_mem->stage_max = iVar9;
        if (((ark_mem->fn_is_current == 0) && (ark_mem->initsetup != 0)) ||
           (lVar10 = step_mem->step_nst, lVar10 != ark_mem->nst)) {
          iVar8 = (*step_mem->fe)(ark_mem->tn,ark_mem->yn,ark_mem->fn,ark_mem->user_data);
          step_mem->nfe = step_mem->nfe + 1;
          if (iVar8 != 0) {
            return -8;
          }
          ark_mem->fn_is_current = 1;
          lVar10 = ark_mem->nst;
          iVar8 = step_mem->req_stages;
        }
        step_mem->step_nst = lVar10 + 1;
        dVar16 = 4.0 / (((double)iVar8 + -1.0) * ((double)iVar8 + 2.0));
        N_VScale(0,ark_mem->yn,ark_mem->tempv1);
        dVar17 = dVar16 * 0.3333333333333333;
        N_VLinearSum(0,ark_mem->h * dVar17,ark_mem->yn,ark_mem->fn,ark_mem->tempv2);
        if ((ark_mem->ProcessStage == (ARKPostProcessFn)0x0) ||
           (iVar8 = (*ark_mem->ProcessStage)
                              (ark_mem->h * dVar17 + ark_mem->tn,ark_mem->tempv2,ark_mem->user_data)
           , iVar8 == 0)) {
          uVar12 = 2;
          local_88 = 0.3333333333333333;
          dVar21 = 0.3333333333333333;
          do {
            dVar18 = dVar21;
            uVar11 = uVar12 * 2;
            uVar13 = uVar12;
            do {
              if (step_mem->req_stages < (int)uVar13) {
                iVar8 = ark_mem->fixedstep;
                iVar9 = (*step_mem->fe)(ark_mem->tcur + ark_mem->h,ark_mem->ycur,ark_mem->tempv2,
                                        ark_mem->user_data);
                step_mem->nfe = step_mem->nfe + 1;
                if (iVar8 == 0) {
                  if (iVar9 < 0) {
                    return -8;
                  }
                  if (iVar9 != 0) {
                    return 9;
                  }
                  *pp_Var3 = ark_mem->yn;
                  *pdVar2 = 0.8;
                  pdVar2[1] = -0.8;
                  pp_Var3[1] = ark_mem->ycur;
                  pdVar2[2] = ark_mem->h * 0.4;
                  pp_Var3[2] = ark_mem->fn;
                  pdVar2[3] = ark_mem->h * 0.4;
                  pp_Var3[3] = ark_mem->tempv2;
                  iVar8 = N_VLinearCombination(4,pdVar2,pp_Var3,ark_mem->tempv1);
                  if (iVar8 != 0) {
                    return -0x1c;
                  }
                  dsm = (sunrealtype)N_VWrmsNorm(ark_mem->tempv1,ark_mem->ewt);
                  *dsmPtr = dsm;
                }
                else {
                  if (iVar9 < 0) {
                    return -8;
                  }
                  if (iVar9 != 0) {
                    return 9;
                  }
                  dsm = *dsmPtr;
                }
                lsrkStep_DomEigUpdateLogic(ark_mem,step_mem,dsm);
                return 0;
              }
              dVar19 = (double)(int)uVar13;
              local_48 = (double)(int)(uVar13 - 1);
              dVar21 = (double)(uVar13 + 2) * local_48;
              uVar12 = uVar13 + 1;
              dVar20 = dVar16 * dVar21 * 0.25;
              uStack_40 = in_XMM3_Qb;
              iVar8 = (*step_mem->fe)(ark_mem->h * dVar17 + ark_mem->tcur,ark_mem->tempv2,
                                      ark_mem->ycur,ark_mem->user_data);
              step_mem->nfe = step_mem->nfe + 1;
              if (iVar8 < 0) {
                return -8;
              }
              if (iVar8 != 0) {
                return 9;
              }
              dVar21 = dVar21 / ((double)uVar12 * (double)uVar11);
              dVar7 = (dVar21 / dVar18) * ((dVar19 + dVar19 + -1.0) / dVar19);
              dVar19 = (dVar21 / local_88) * (-local_48 / dVar19);
              *pdVar2 = ark_mem->h * dVar16 * dVar7;
              *pp_Var3 = ark_mem->ycur;
              pdVar2[1] = dVar19;
              pp_Var3[1] = ark_mem->tempv1;
              in_XMM3_Qb = 0;
              pdVar2[2] = (1.0 - dVar7) - dVar19;
              pp_Var3[2] = ark_mem->yn;
              pdVar2[3] = dVar7;
              pp_Var3[3] = ark_mem->tempv2;
              pdVar2[4] = -(dVar16 * dVar7) * (1.0 - dVar18) * ark_mem->h;
              pp_Var3[4] = ark_mem->fn;
              iVar8 = N_VLinearCombination(5,pdVar2,pp_Var3,ark_mem->ycur);
              if (iVar8 != 0) {
                return -0x1c;
              }
              iVar8 = step_mem->req_stages;
              if ((int)uVar13 < iVar8 && ark_mem->ProcessStage != (ARKPostProcessFn)0x0) {
                iVar8 = (*ark_mem->ProcessStage)
                                  (ark_mem->h * dVar20 + ark_mem->tcur,ark_mem->ycur,
                                   ark_mem->user_data);
                if (iVar8 != 0) {
                  return -0x26;
                }
                iVar8 = step_mem->req_stages;
              }
              uVar11 = uVar11 + 2;
              bVar6 = iVar8 <= (int)uVar13;
              uVar13 = uVar12;
            } while (bVar6);
            p_Var5 = ark_mem->tempv1;
            ark_mem->tempv1 = ark_mem->tempv2;
            ark_mem->tempv2 = p_Var5;
            N_VScale(0,ark_mem->ycur);
            dVar17 = dVar20;
            local_88 = dVar18;
          } while( true );
        }
        iVar8 = -0x26;
      }
      else if (ark_mem->fixedstep == 0) {
        pAVar4 = ark_mem->hadapt_mem;
        ark_mem->eta = ((((double)((iVar8 + 1) * iVar8) + -2.0) * pAVar4->safety) /
                       (step_mem->spectral_radius + step_mem->spectral_radius)) / ark_mem->h;
        *nflagPtr = 0xb;
        plVar1 = &pAVar4->nst_exp;
        *plVar1 = *plVar1 + 1;
        iVar8 = 0xb;
      }
      else {
        iVar8 = -0x32;
        arkProcessError(ark_mem,-0x32,0x355,"lsrkStep_TakeStepRKL",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                        ,
                        "Unable to achieve stable results: Either reduce the step size or increase the stage_max_limit"
                       );
      }
    }
  }
  return iVar8;
}

Assistant:

int lsrkStep_TakeStepRKL(ARKodeMem ark_mem, sunrealtype* dsmPtr, int* nflagPtr)
{
  int retval;
  sunrealtype hmax, w1, bjm1, bjm2, mus, bj, ajm1, cjm1, temj, cj, mu, nu;
  const sunrealtype p8 = SUN_RCONST(0.8), p4 = SUN_RCONST(0.4);
  ARKodeLSRKStepMem step_mem;

  /* initialize algebraic solver convergence flag to success,
     temporal error estimate to zero */
  *nflagPtr = ARK_SUCCESS;
  *dsmPtr   = ZERO;

  /* access ARKodeLSRKStepMem structure */
  retval = lsrkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  sunrealtype* cvals = step_mem->cvals;
  N_Vector* Xvecs    = step_mem->Xvecs;

  /* Compute dominant eigenvalue and update stats */
  if (step_mem->dom_eig_update)
  {
    retval = lsrkStep_ComputeNewDomEig(ark_mem, step_mem);
    if (retval != ARK_SUCCESS) { return retval; }
  }

  sunrealtype ss =
    SUNRceil((SUNRsqrt(SUN_RCONST(9.0) + SUN_RCONST(8.0) * SUNRabs(ark_mem->h) *
                                           step_mem->spectral_radius) -
              ONE) /
             TWO);

  ss = SUNMAX(ss, SUN_RCONST(2.0));

  if (ss >= step_mem->stage_max_limit)
  {
    SUNLogInfo(ARK_LOGGER, "compute-num-stages",
               "spectral radius = " SUN_FORMAT_G ", num stages = " SUN_FORMAT_G
               ", max stages = %i, max stage limit = %i",
               step_mem->spectral_radius, ss, step_mem->stage_max,
               step_mem->stage_max_limit);

    if (!ark_mem->fixedstep)
    {
      hmax =
        ark_mem->hadapt_mem->safety *
        (SUNSQR(step_mem->stage_max_limit) + step_mem->stage_max_limit - TWO) /
        (TWO * step_mem->spectral_radius);
      ark_mem->eta = hmax / ark_mem->h;
      *nflagPtr    = ARK_RETRY_STEP;
      ark_mem->hadapt_mem->nst_exp++;
      return ARK_RETRY_STEP;
    }
    else
    {
      arkProcessError(ark_mem, ARK_MAX_STAGE_LIMIT_FAIL, __LINE__, __func__,
                      __FILE__,
                      "Unable to achieve stable results: Either reduce the "
                      "step size or increase the stage_max_limit");
      return ARK_MAX_STAGE_LIMIT_FAIL;
    }
  }

  step_mem->req_stages = (int)ss;
  step_mem->stage_max  = SUNMAX(step_mem->req_stages, step_mem->stage_max);

  SUNLogInfo(ARK_LOGGER, "compute-num-stages",
             "spectral radius = " SUN_FORMAT_G
             ", num stages = %i, max stages = %i, max stage limit = %i",
             step_mem->spectral_radius, step_mem->req_stages,
             step_mem->stage_max, step_mem->stage_max_limit);
  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, 0,
             ark_mem->tcur);
  SUNLogExtraDebugVec(ARK_LOGGER, "stage", ark_mem->yn, "z_0(:) =");

  /* Compute RHS function, if necessary. */
  if ((!ark_mem->fn_is_current && ark_mem->initsetup) ||
      (step_mem->step_nst != ark_mem->nst))
  {
    retval = step_mem->fe(ark_mem->tn, ark_mem->yn, ark_mem->fn,
                          ark_mem->user_data);
    step_mem->nfe++;
    if (retval != ARK_SUCCESS)
    {
      SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->fn, "F_0(:) =");
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);
      return (ARK_RHSFUNC_FAIL);
    }
    ark_mem->fn_is_current = SUNTRUE;
  }

  SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->fn, "F_0(:) =");
  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");

  /* Track the number of successful steps to determine if the previous step failed. */
  step_mem->step_nst = ark_mem->nst + 1;

  w1 = FOUR / ((step_mem->req_stages + TWO) * (step_mem->req_stages - ONE));

  bjm2 = ONE / THREE;
  bjm1 = bjm2;

  /* Evaluate the first stage */
  N_VScale(ONE, ark_mem->yn, ark_mem->tempv1);

  mus  = w1 * bjm1;
  cjm1 = mus;

  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, 1,
             ark_mem->tn + ark_mem->h * mus);

  N_VLinearSum(ONE, ark_mem->yn, ark_mem->h * mus, ark_mem->fn, ark_mem->tempv2);

  /* apply user-supplied stage postprocessing function (if supplied) */
  if (ark_mem->ProcessStage != NULL)
  {
    retval = ark_mem->ProcessStage(ark_mem->tn + ark_mem->h * mus,
                                   ark_mem->tempv2, ark_mem->user_data);
    if (retval != 0)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed postprocess stage, retval = %i", retval);
      return ARK_POSTPROCESS_STAGE_FAIL;
    }
  }

  /* Evaluate stages j = 2,...,step_mem->req_stages */
  for (int j = 2; j <= step_mem->req_stages; j++)
  {
    temj = (j + TWO) * (j - ONE);
    bj   = temj / (TWO * j * (j + ONE));
    ajm1 = ONE - bjm1;
    mu   = (TWO * j - ONE) / j * (bj / bjm1);
    nu   = -(j - ONE) / j * (bj / bjm2);
    mus  = w1 * mu;
    cj   = temj * w1 / FOUR;

    /* Use the ycur array for temporary storage here */
    retval = step_mem->fe(ark_mem->tcur + ark_mem->h * cjm1, ark_mem->tempv2,
                          ark_mem->ycur, ark_mem->user_data);
    step_mem->nfe++;

    SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->ycur,
                        "F_%i(:) =", j - 1);
    SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);

    if (retval < 0) { return ARK_RHSFUNC_FAIL; }
    if (retval > 0) { return RHSFUNC_RECVR; }

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
    SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, j,
               ark_mem->tn + ark_mem->h * cj);

    cvals[0] = mus * ark_mem->h;
    Xvecs[0] = ark_mem->ycur;
    cvals[1] = nu;
    Xvecs[1] = ark_mem->tempv1;
    cvals[2] = ONE - mu - nu;
    Xvecs[2] = ark_mem->yn;
    cvals[3] = mu;
    Xvecs[3] = ark_mem->tempv2;
    cvals[4] = -mus * ajm1 * ark_mem->h;
    Xvecs[4] = ark_mem->fn;

    retval = N_VLinearCombination(5, cvals, Xvecs, ark_mem->ycur);
    if (retval != 0)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed vector op, retval = %i", retval);
      return ARK_VECTOROP_ERR;
    }

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL && j < step_mem->req_stages)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur + ark_mem->h * cj,
                                     ark_mem->ycur, ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return ARK_POSTPROCESS_STAGE_FAIL;
      }
    }

    /* Shift the data for the next stage */
    if (j < step_mem->req_stages)
    {
      /* To avoid two data copies we swap ARKODE's tempv1 and tempv2 pointers*/
      N_Vector temp   = ark_mem->tempv1;
      ark_mem->tempv1 = ark_mem->tempv2;
      ark_mem->tempv2 = temp;

      N_VScale(ONE, ark_mem->ycur, ark_mem->tempv2);

      cjm1 = cj;
      bjm2 = bjm1;
      bjm1 = bj;
    }
  }

  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogExtraDebugVec(ARK_LOGGER, "updated solution", ark_mem->ycur, "ycur(:) =");
  SUNLogInfo(ARK_LOGGER, "begin-compute-embedding", "");

  /* Compute yerr (if step adaptivity enabled) */
  if (!ark_mem->fixedstep)
  {
    retval = step_mem->fe(ark_mem->tcur + ark_mem->h, ark_mem->ycur,
                          ark_mem->tempv2, ark_mem->user_data);
    step_mem->nfe++;

    SUNLogExtraDebugVec(ARK_LOGGER, "solution RHS", ark_mem->tempv2, "F_n(:) =");
    SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-compute-embedding",
                 "status = failed rhs eval, retval = %i", retval);

    if (retval < 0) { return ARK_RHSFUNC_FAIL; }
    if (retval > 0) { return RHSFUNC_RECVR; }

    /* Estimate the local error and compute its weighted RMS norm */
    cvals[0] = p8;
    Xvecs[0] = ark_mem->yn;
    cvals[1] = -p8;
    Xvecs[1] = ark_mem->ycur;
    cvals[2] = p4 * ark_mem->h;
    Xvecs[2] = ark_mem->fn;
    cvals[3] = p4 * ark_mem->h;
    Xvecs[3] = ark_mem->tempv2;

    retval = N_VLinearCombination(4, cvals, Xvecs, ark_mem->tempv1);
    if (retval != 0)
    {
      SUNLogInfo(ARK_LOGGER, "end-compute-embedding",
                 "status = failed vector op, retval = %i", retval);
      return ARK_VECTOROP_ERR;
    }
    *dsmPtr = N_VWrmsNorm(ark_mem->tempv1, ark_mem->ewt);
    lsrkStep_DomEigUpdateLogic(ark_mem, step_mem, *dsmPtr);
  }
  else
  {
    retval = step_mem->fe(ark_mem->tcur + ark_mem->h, ark_mem->ycur,
                          ark_mem->tempv2, ark_mem->user_data);
    step_mem->nfe++;

    SUNLogExtraDebugVec(ARK_LOGGER, "solution RHS", ark_mem->tempv2, "F_n(:) =");
    SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-compute-embedding",
                 "status = failed rhs eval, retval = %i", retval);

    if (retval < 0) { return ARK_RHSFUNC_FAIL; }
    if (retval > 0) { return RHSFUNC_RECVR; }

    lsrkStep_DomEigUpdateLogic(ark_mem, step_mem, *dsmPtr);
  }

  SUNLogInfo(ARK_LOGGER, "end-compute-embedding", "status = success");

  return ARK_SUCCESS;
}